

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O1

DASHEventMessageBoxv1 * __thiscall
event_track::EventMessageInstanceBox::to_emsg_v1
          (DASHEventMessageBoxv1 *__return_storage_ptr__,EventMessageInstanceBox *this,
          uint64_t presentation_time)

{
  (__return_storage_ptr__->super_full_box).super_box.size_ = 0;
  (__return_storage_ptr__->super_full_box).super_box.large_size_ = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_full_box).super_box.box_type_.field_2;
  (__return_storage_ptr__->super_full_box).super_box.box_type_._M_string_length = 0;
  (__return_storage_ptr__->super_full_box).super_box.box_type_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_full_box).super_box.box_data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_full_box).super_box.box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (__return_storage_ptr__->super_full_box).super_box.field_0x62 = 0;
  *(undefined8 *)&(__return_storage_ptr__->super_full_box).super_box.field_0x64 = 0;
  (__return_storage_ptr__->super_full_box).super_box._vptr_box = (_func_int **)&PTR_size_0011cab0;
  (__return_storage_ptr__->scheme_id_uri_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->scheme_id_uri_).field_2;
  (__return_storage_ptr__->scheme_id_uri_)._M_string_length = 0;
  (__return_storage_ptr__->scheme_id_uri_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  (__return_storage_ptr__->value_)._M_string_length = 0;
  (__return_storage_ptr__->value_).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->message_data_).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined4 *)&(__return_storage_ptr__->super_full_box).field_0x6c =
       *(undefined4 *)&(this->super_full_box).field_0x6c;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->scheme_id_uri_);
  __return_storage_ptr__->event_duration_ = this->event_duration_;
  __return_storage_ptr__->id_ = this->id_;
  __return_storage_ptr__->presentation_time_ = presentation_time + this->presentation_time_delta_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->message_data_,&this->message_data_);
  return __return_storage_ptr__;
}

Assistant:

DASHEventMessageBoxv1 to_emsg_v1(uint64_t presentation_time)
		{
			DASHEventMessageBoxv1 e; 
			e.timescale_ = reserved_;
			e.scheme_id_uri_ = scheme_id_uri_;
			e.event_duration_ = event_duration_;
			e.id_ = id_;
			e.presentation_time_ = presentation_time_delta_ + presentation_time;
			e.value_ = value_;
			e.message_data_ = message_data_;
			return e;
		}